

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t XXH3_len_9to16_64b(xxh_u8 *input,size_t len,xxh_u8 *secret,XXH64_hash_t seed)

{
  xxh_u64 xVar1;
  xxh_u64 xVar2;
  xxh_u64 xVar3;
  xxh_u64 xVar4;
  xxh_u64 xVar5;
  xxh_u64 xVar6;
  XXH64_hash_t XVar7;
  long in_RCX;
  xxh_u64 in_RSI;
  xxh_u64 acc;
  xxh_u64 input_hi;
  xxh_u64 input_lo;
  xxh_u64 bitflip2;
  xxh_u64 bitflip1;
  
  xVar1 = XXH_readLE64((void *)0x12a4a6);
  xVar2 = XXH_readLE64((void *)0x12a4b8);
  xVar3 = XXH_readLE64((void *)0x12a4da);
  xVar4 = XXH_readLE64((void *)0x12a4ed);
  xVar5 = XXH_readLE64((void *)0x12a50c);
  xVar6 = XXH_readLE64((void *)0x12a529);
  xVar1 = XXH_swap64(xVar5 ^ (xVar1 ^ xVar2) + in_RCX);
  XXH3_mul128_fold64(in_RSI + xVar1 + (xVar6 ^ (xVar3 ^ xVar4) - in_RCX),in_RSI);
  XVar7 = XXH3_avalanche(0x12a585);
  return XVar7;
}

Assistant:

XXH_FORCE_INLINE XXH64_hash_t XXH3_len_9to16_64b(const xxh_u8* input,
                                                 size_t len,
                                                 const xxh_u8* secret,
                                                 XXH64_hash_t seed) {
  XXH_ASSERT(input != NULL);
  XXH_ASSERT(secret != NULL);
  XXH_ASSERT(8 <= len && len <= 16);
  {
    xxh_u64 const bitflip1 =
        (XXH_readLE64(secret + 24) ^ XXH_readLE64(secret + 32)) + seed;
    xxh_u64 const bitflip2 =
        (XXH_readLE64(secret + 40) ^ XXH_readLE64(secret + 48)) - seed;
    xxh_u64 const input_lo = XXH_readLE64(input) ^ bitflip1;
    xxh_u64 const input_hi = XXH_readLE64(input + len - 8) ^ bitflip2;
    xxh_u64 const acc = len + XXH_swap64(input_lo) + input_hi +
                        XXH3_mul128_fold64(input_lo, input_hi);
    return XXH3_avalanche(acc);
  }
}